

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O0

void __thiscall MIDIplay::noteUpdateAll(MIDIplay *this,size_t midCh,uint props_mask)

{
  bool bVar1;
  reference pMVar2;
  pl_iterator<pl_cell<MIDIplay::MIDIchannel::NoteInfo>_> i_00;
  notes_iterator j;
  notes_iterator i;
  uint props_mask_local;
  size_t midCh_local;
  MIDIplay *this_local;
  
  pMVar2 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::operator[]
                     (&this->m_midiChannels,midCh);
  j.cell_ = (pl_cell<MIDIplay::MIDIchannel::NoteInfo> *)
            pl_list<MIDIplay::MIDIchannel::NoteInfo>::begin(&pMVar2->activenotes);
  while( true ) {
    bVar1 = pl_iterator<pl_cell<MIDIplay::MIDIchannel::NoteInfo>_>::is_end(&j);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    i_00 = pl_iterator<pl_cell<MIDIplay::MIDIchannel::NoteInfo>_>::operator++(&j,0);
    noteUpdate(this,midCh,(notes_iterator)i_00.cell_,props_mask,-1);
  }
  return;
}

Assistant:

void MIDIplay::noteUpdateAll(size_t midCh, unsigned props_mask)
{
    for(MIDIchannel::notes_iterator
        i = m_midiChannels[midCh].activenotes.begin(); !i.is_end();)
    {
        MIDIchannel::notes_iterator j(i++);
        noteUpdate(midCh, j, props_mask);
    }
}